

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StyleSheetFactory.cpp
# Opt level: O3

UniquePtr<const_StyleSheetContainer> __thiscall
Rml::StyleSheetFactory::LoadStyleSheetContainer(StyleSheetFactory *this,String *sheet)

{
  bool bVar1;
  tuple<Rml::StreamFile_*,_std::default_delete<Rml::StreamFile>_> this_00;
  StyleSheetContainer *this_01;
  String *in_RDX;
  pointer __old_p;
  UniquePtr<Rml::StreamFile> stream;
  __uniq_ptr_impl<Rml::StreamFile,_std::default_delete<Rml::StreamFile>_> local_20;
  
  this_00.super__Tuple_impl<0UL,_Rml::StreamFile_*,_std::default_delete<Rml::StreamFile>_>.
  super__Head_base<0UL,_Rml::StreamFile_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_Rml::StreamFile_*,_std::default_delete<Rml::StreamFile>_>)
       operator_new(0x158);
  StreamFile::StreamFile
            ((StreamFile *)
             this_00.
             super__Tuple_impl<0UL,_Rml::StreamFile_*,_std::default_delete<Rml::StreamFile>_>.
             super__Head_base<0UL,_Rml::StreamFile_*,_false>._M_head_impl);
  local_20._M_t.super__Tuple_impl<0UL,_Rml::StreamFile_*,_std::default_delete<Rml::StreamFile>_>.
  super__Head_base<0UL,_Rml::StreamFile_*,_false>._M_head_impl =
       (tuple<Rml::StreamFile_*,_std::default_delete<Rml::StreamFile>_>)
       (tuple<Rml::StreamFile_*,_std::default_delete<Rml::StreamFile>_>)
       this_00.super__Tuple_impl<0UL,_Rml::StreamFile_*,_std::default_delete<Rml::StreamFile>_>.
       super__Head_base<0UL,_Rml::StreamFile_*,_false>._M_head_impl;
  bVar1 = StreamFile::Open((StreamFile *)
                           this_00.
                           super__Tuple_impl<0UL,_Rml::StreamFile_*,_std::default_delete<Rml::StreamFile>_>
                           .super__Head_base<0UL,_Rml::StreamFile_*,_false>._M_head_impl,in_RDX);
  if (bVar1) {
    this_01 = (StyleSheetContainer *)operator_new(0x48);
    StyleSheetContainer::StyleSheetContainer(this_01);
    bVar1 = StyleSheetContainer::LoadStyleSheetContainer
                      (this_01,(Stream *)
                               local_20._M_t.
                               super__Tuple_impl<0UL,_Rml::StreamFile_*,_std::default_delete<Rml::StreamFile>_>
                               .super__Head_base<0UL,_Rml::StreamFile_*,_false>._M_head_impl,1);
    if (bVar1) goto LAB_0026d9d7;
    (*this_01->_vptr_StyleSheetContainer[1])(this_01);
  }
  this_01 = (StyleSheetContainer *)0x0;
LAB_0026d9d7:
  (this->stylesheets).mKeyVals = (Node *)this_01;
  ::std::unique_ptr<Rml::StreamFile,_std::default_delete<Rml::StreamFile>_>::~unique_ptr
            ((unique_ptr<Rml::StreamFile,_std::default_delete<Rml::StreamFile>_> *)&local_20);
  return (__uniq_ptr_data<const_Rml::StyleSheetContainer,_std::default_delete<const_Rml::StyleSheetContainer>,_true,_true>
          )(__uniq_ptr_data<const_Rml::StyleSheetContainer,_std::default_delete<const_Rml::StyleSheetContainer>,_true,_true>
            )this;
}

Assistant:

UniquePtr<const StyleSheetContainer> StyleSheetFactory::LoadStyleSheetContainer(const String& sheet)
{
	UniquePtr<StyleSheetContainer> new_style_sheet;

	// Open stream, construct new sheet and pass the stream into the sheet
	auto stream = MakeUnique<StreamFile>();
	if (stream->Open(sheet))
	{
		new_style_sheet = MakeUnique<StyleSheetContainer>();
		if (!new_style_sheet->LoadStyleSheetContainer(stream.get()))
		{
			new_style_sheet.reset();
		}
	}

	return new_style_sheet;
}